

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

void __thiscall
soul::AST::ModuleBase::performLocalNameSearch
          (ModuleBase *this,NameSearch *search,Statement *param_2)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Function *pFVar4;
  size_type sVar5;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  ModuleBase *pMVar6;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  ArrayView<soul::pool_ref<soul::AST::ProcessorAliasDeclaration>_> local_110;
  string *local_100;
  ArrayView<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>_> local_f8;
  pool_ref *local_e8;
  pool_ref<soul::AST::ModuleBase> *m;
  pool_ref<soul::AST::ModuleBase> *__end3_1;
  pool_ref<soul::AST::ModuleBase> *__begin3_1;
  ArrayView<soul::pool_ref<soul::AST::ModuleBase>_> *local_c0;
  ArrayView<soul::pool_ref<soul::AST::ModuleBase>_> *__range3_1;
  ArrayView<soul::pool_ref<soul::AST::EndpointDeclaration>_> local_b0;
  pool_ref *local_a0;
  pool_ref<soul::AST::Function> *f;
  pool_ref<soul::AST::Function> *__end3;
  pool_ref<soul::AST::Function> *__begin3;
  ArrayView<soul::pool_ref<soul::AST::Function>_> *local_78;
  ArrayView<soul::pool_ref<soul::AST::Function>_> *__range3;
  ArrayView<soul::pool_ref<soul::AST::UsingDeclaration>_> local_68;
  string *local_58;
  ArrayView<soul::pool_ref<soul::AST::StructDeclaration>_> local_50;
  string *local_40;
  ArrayView<soul::pool_ref<soul::AST::VariableDeclaration>_> local_38;
  Identifier local_28;
  Identifier targetName;
  Statement *param_2_local;
  NameSearch *search_local;
  ModuleBase *this_local;
  
  targetName.name = (string *)param_2;
  local_28 = IdentifierPath::getLastPart(&search->partiallyQualifiedPath);
  if ((search->findVariables & 1U) != 0) {
    iVar2 = (*(this->super_Scope)._vptr_Scope[0xc])(&this->super_Scope);
    local_38.s = (pool_ref<soul::AST::VariableDeclaration> *)CONCAT44(extraout_var,iVar2);
    local_40 = local_28.name;
    Scope::NameSearch::
    addFirstWithName<soul::ArrayView<soul::pool_ref<soul::AST::VariableDeclaration>>>
              (search,&local_38,local_28);
  }
  if ((search->findTypes & 1U) != 0) {
    iVar2 = (*(this->super_Scope)._vptr_Scope[0xe])(&this->super_Scope);
    local_50.s = (pool_ref<soul::AST::StructDeclaration> *)CONCAT44(extraout_var_00,iVar2);
    local_58 = local_28.name;
    Scope::NameSearch::
    addFirstWithName<soul::ArrayView<soul::pool_ref<soul::AST::StructDeclaration>>>
              (search,&local_50,local_28);
    iVar2 = (*(this->super_ASTObject)._vptr_ASTObject[9])();
    local_68.s = (pool_ref<soul::AST::UsingDeclaration> *)CONCAT44(extraout_var_01,iVar2);
    __range3 = (ArrayView<soul::pool_ref<soul::AST::Function>_> *)local_28.name;
    Scope::NameSearch::
    addFirstWithName<soul::ArrayView<soul::pool_ref<soul::AST::UsingDeclaration>>>
              (search,&local_68,local_28);
  }
  if ((search->findFunctions & 1U) != 0) {
    iVar2 = (*(this->super_Scope)._vptr_Scope[0xd])(&this->super_Scope);
    __begin3 = (pool_ref<soul::AST::Function> *)CONCAT44(extraout_var_02,iVar2);
    local_78 = (ArrayView<soul::pool_ref<soul::AST::Function>_> *)&__begin3;
    __end3 = ArrayView<soul::pool_ref<soul::AST::Function>_>::begin(local_78);
    f = ArrayView<soul::pool_ref<soul::AST::Function>_>::end(local_78);
    for (; __end3 != f; __end3 = __end3 + 1) {
      local_a0 = (pool_ref *)__end3;
      pFVar4 = pool_ref<soul::AST::Function>::operator->(__end3);
      bVar1 = Identifier::operator==(&pFVar4->name,&local_28);
      if (bVar1) {
        if (-1 < search->requiredNumFunctionArgs) {
          pFVar4 = pool_ref<soul::AST::Function>::operator->
                             ((pool_ref<soul::AST::Function> *)local_a0);
          sVar5 = std::
                  vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
                  ::size(&pFVar4->parameters);
          if (sVar5 != (uint)search->requiredNumFunctionArgs) goto LAB_003ec0e9;
        }
        pFVar4 = pool_ref::operator_cast_to_Function_(local_a0);
        Scope::NameSearch::addResult(search,&pFVar4->super_ASTObject);
      }
LAB_003ec0e9:
    }
  }
  if ((search->findEndpoints & 1U) != 0) {
    iVar2 = (*(this->super_ASTObject)._vptr_ASTObject[8])();
    local_b0.s = (pool_ref<soul::AST::EndpointDeclaration> *)CONCAT44(extraout_var_03,iVar2);
    __range3_1 = (ArrayView<soul::pool_ref<soul::AST::ModuleBase>_> *)local_28.name;
    Scope::NameSearch::
    addFirstWithName<soul::ArrayView<soul::pool_ref<soul::AST::EndpointDeclaration>>>
              (search,&local_b0,local_28);
  }
  if (((search->findNamespaces & 1U) != 0) || ((search->findProcessors & 1U) != 0)) {
    iVar2 = (*(this->super_Scope)._vptr_Scope[0x11])(&this->super_Scope);
    __begin3_1 = (pool_ref<soul::AST::ModuleBase> *)CONCAT44(extraout_var_04,iVar2);
    local_c0 = (ArrayView<soul::pool_ref<soul::AST::ModuleBase>_> *)&__begin3_1;
    __end3_1 = ArrayView<soul::pool_ref<soul::AST::ModuleBase>_>::begin(local_c0);
    m = ArrayView<soul::pool_ref<soul::AST::ModuleBase>_>::end(local_c0);
    for (; __end3_1 != m; __end3_1 = __end3_1 + 1) {
      local_e8 = (pool_ref *)__end3_1;
      pMVar6 = pool_ref<soul::AST::ModuleBase>::operator->(__end3_1);
      bVar1 = Identifier::operator==(&pMVar6->name,&local_28);
      if (bVar1) {
        if ((search->findNamespaces & 1U) == 0) {
LAB_003ec241:
          if ((search->findProcessors & 1U) == 0) goto LAB_003ec2ac;
          pMVar6 = pool_ref<soul::AST::ModuleBase>::operator->
                             ((pool_ref<soul::AST::ModuleBase> *)local_e8);
          uVar3 = (*(pMVar6->super_ASTObject)._vptr_ASTObject[4])();
          if ((uVar3 & 1) == 0) {
            pMVar6 = pool_ref<soul::AST::ModuleBase>::operator->
                               ((pool_ref<soul::AST::ModuleBase> *)local_e8);
            uVar3 = (*(pMVar6->super_ASTObject)._vptr_ASTObject[5])();
            if ((uVar3 & 1) == 0) goto LAB_003ec2ac;
          }
        }
        else {
          pMVar6 = pool_ref<soul::AST::ModuleBase>::operator->
                             ((pool_ref<soul::AST::ModuleBase> *)local_e8);
          uVar3 = (*(pMVar6->super_ASTObject)._vptr_ASTObject[6])();
          if ((uVar3 & 1) == 0) goto LAB_003ec241;
        }
        pMVar6 = pool_ref::operator_cast_to_ModuleBase_(local_e8);
        Scope::NameSearch::addResult(search,&pMVar6->super_ASTObject);
        break;
      }
LAB_003ec2ac:
    }
    if ((search->findNamespaces & 1U) != 0) {
      iVar2 = (*(this->super_ASTObject)._vptr_ASTObject[10])();
      local_f8.s = (pool_ref<soul::AST::NamespaceAliasDeclaration> *)CONCAT44(extraout_var_05,iVar2)
      ;
      local_100 = local_28.name;
      Scope::NameSearch::
      addFirstWithName<soul::ArrayView<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>>>
                (search,&local_f8,local_28);
    }
    if ((search->findProcessors & 1U) != 0) {
      iVar2 = (*(this->super_Scope)._vptr_Scope[0x12])(&this->super_Scope);
      local_110.s = (pool_ref<soul::AST::ProcessorAliasDeclaration> *)
                    CONCAT44(extraout_var_06,iVar2);
      Scope::NameSearch::
      addFirstWithName<soul::ArrayView<soul::pool_ref<soul::AST::ProcessorAliasDeclaration>>>
                (search,&local_110,local_28);
    }
  }
  return;
}

Assistant:

void performLocalNameSearch (NameSearch& search, const Statement*) const override
        {
            auto targetName = search.partiallyQualifiedPath.getLastPart();

            if (search.findVariables)
                search.addFirstWithName (getVariables(), targetName);

            if (search.findTypes)
            {
                search.addFirstWithName (getStructDeclarations(), targetName);
                search.addFirstWithName (getUsingDeclarations(), targetName);
            }

            if (search.findFunctions)
            {
                for (auto& f : getFunctions())
                {
                    if (f->name == targetName
                         && (search.requiredNumFunctionArgs < 0
                              || f->parameters.size() == static_cast<uint32_t> (search.requiredNumFunctionArgs)))
                    {
                        search.addResult (f);
                    }
                }
            }

            if (search.findEndpoints)
                search.addFirstWithName (getEndpoints(), targetName);

            if (search.findNamespaces || search.findProcessors)
            {
                for (auto& m : getSubModules())
                {
                    if (m->name == targetName)
                    {
                        if ((search.findNamespaces && m->isNamespace())
                             || (search.findProcessors && (m->isProcessor() || m->isGraph())))
                        {
                            search.addResult (m);
                            break;
                        }
                    }
                }

                if (search.findNamespaces)  search.addFirstWithName (getNamespaceAliases(), targetName);
                if (search.findProcessors)  search.addFirstWithName (getProcessorAliases(), targetName);
            }
        }